

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rprog.c
# Opt level: O0

bool move_prog_door_close(ROOM_INDEX_DATA *room,CHAR_DATA *ch,int dir)

{
  int in_EDX;
  long in_RDI;
  __type_conflict2 _Var1;
  EXIT_DATA *exit;
  void *in_stack_ffffffffffffffc8;
  CHAR_DATA *arg1;
  CHAR_DATA *ch_00;
  undefined4 in_stack_ffffffffffffffe0;
  
  ch_00 = *(CHAR_DATA **)(in_RDI + 0x38 + (long)in_EDX * 8);
  arg1 = ch_00->next_in_room;
  _Var1 = std::pow<int,int>(0,0x6bdff3);
  if (((ulong)arg1 & (long)_Var1) == 0) {
    act((char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),ch_00,arg1,in_stack_ffffffffffffffc8,0);
    act((char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),ch_00,arg1,in_stack_ffffffffffffffc8,0);
    _Var1 = std::pow<int,int>(0,0x6be058);
    ch_00->next_in_room = (CHAR_DATA *)((long)_Var1 | (ulong)ch_00->next_in_room);
    _Var1 = std::pow<int,int>(0,0x6be076);
    ch_00->next_in_room = (CHAR_DATA *)((long)_Var1 | (ulong)ch_00->next_in_room);
    _Var1 = std::pow<int,int>(0,0x6be097);
    ch_00->next_in_room = (CHAR_DATA *)((long)_Var1 | (ulong)ch_00->next_in_room);
  }
  return true;
}

Assistant:

bool move_prog_door_close(ROOM_INDEX_DATA *room, CHAR_DATA *ch, int dir)
{
	EXIT_DATA *exit = room->exit[dir];

	if (IS_SET(exit->exit_info, EX_CLOSED))
		return true;

	act("The door to the north closes up behind you, locking with a tiny click.", ch, 0, 0, TO_CHAR);
	act("The door to the south closes up behind $n, locking with a tiny click.", ch, 0, 0, TO_ROOM);
	SET_BIT(exit->exit_info, EX_CLOSED);
	SET_BIT(exit->exit_info, EX_LOCKED);
	SET_BIT(exit->exit_info, EX_NONOBVIOUS);

	return true;
}